

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_aa93::MemoryMappedFileTest_DoubleMap_Test::TestBody
          (MemoryMappedFileTest_DoubleMap_Test *this)

{
  CStringRef path;
  StringRef data;
  StringRef data_00;
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *gtest_dt;
  RE *gtest_regex;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  File file2;
  string filename2;
  File file1;
  MemoryMappedFile<fmt::File> f;
  char *start;
  string filename1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  RE *in_stack_fffffffffffffd20;
  RE *in_stack_fffffffffffffd28;
  MemoryMappedFile<fmt::File> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3c;
  undefined1 in_stack_fffffffffffffd3d;
  undefined1 in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  DeathTest *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  Type in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  undefined2 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  char *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  CStringRef CVar6;
  Message *in_stack_fffffffffffffd98;
  AssertHelper *in_stack_fffffffffffffda0;
  File *in_stack_fffffffffffffdd0;
  ReturnSentinel local_228;
  scoped_ptr<testing::internal::DeathTest> local_220;
  DeathTest *local_218;
  undefined1 local_210 [144];
  undefined1 *local_180;
  size_t local_168;
  undefined4 local_15c;
  AssertionResult local_158 [2];
  allocator local_131;
  string local_130 [32];
  AssertionResult local_110 [3];
  string local_d8 [32];
  string local_b8 [48];
  MemoryMappedFileBase local_88;
  char *local_78;
  string local_48 [32];
  string local_28 [40];
  
  CVar6.data_ = (char *)local_48;
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_48);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
  data.size_ = in_stack_fffffffffffffd88;
  data.data_ = in_stack_fffffffffffffd80;
  WriteFile(CVar6,data);
  local_78 = (char *)0x0;
  mp::MemoryMappedFile<fmt::File>::MemoryMappedFile((MemoryMappedFile<fmt::File> *)0x11747e);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  path.data_._4_2_ = in_stack_fffffffffffffd54;
  path.data_._0_4_ = in_stack_fffffffffffffd50;
  path.data_._6_1_ = in_stack_fffffffffffffd56;
  path.data_._7_1_ = in_stack_fffffffffffffd57;
  fmt::File::File((File *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),path,
                  (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  sVar4 = fmt::File::size(in_stack_fffffffffffffdd0);
  mp::MemoryMappedFile<fmt::File>::map
            (in_stack_fffffffffffffd30,(File *)in_stack_fffffffffffffd28,
             (size_t)in_stack_fffffffffffffd20);
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_d8);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
  data_00.size_ = sVar4;
  data_00.data_ = in_stack_fffffffffffffd80;
  WriteFile(CVar6,data_00);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  CVar6.data_._4_2_ = in_stack_fffffffffffffd54;
  CVar6.data_._0_4_ = in_stack_fffffffffffffd50;
  CVar6.data_._6_1_ = in_stack_fffffffffffffd56;
  CVar6.data_._7_1_ = in_stack_fffffffffffffd57;
  fmt::File::File((File *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),CVar6,
                  (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  fmt::File::size(in_stack_fffffffffffffdd0);
  mp::MemoryMappedFile<fmt::File>::map
            (in_stack_fffffffffffffd30,(File *)in_stack_fffffffffffffd28,
             (size_t)in_stack_fffffffffffffd20);
  local_78 = mp::internal::MemoryMappedFileBase::start(&local_88);
  pcVar5 = mp::internal::MemoryMappedFileBase::start(&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,pcVar5,4,&local_131);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT17(in_stack_fffffffffffffd3f,
                              CONCAT16(in_stack_fffffffffffffd3e,
                                       CONCAT15(in_stack_fffffffffffffd3d,
                                                CONCAT14(in_stack_fffffffffffffd3c,
                                                         in_stack_fffffffffffffd38)))),
             (char *)in_stack_fffffffffffffd30,(char (*) [5])in_stack_fffffffffffffd28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))));
    testing::AssertionResult::failure_message((AssertionResult *)0x1177ae);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))),
               in_stack_fffffffffffffd4c,(char *)in_stack_fffffffffffffd40,
               CONCAT13(in_stack_fffffffffffffd3f,
                        CONCAT12(in_stack_fffffffffffffd3e,
                                 CONCAT11(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd3c))),
               (char *)in_stack_fffffffffffffd30);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
    testing::Message::~Message((Message *)0x11780b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x117879);
  local_15c = 4;
  local_168 = mp::internal::MemoryMappedFileBase::size(&local_88);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT17(in_stack_fffffffffffffd3f,
                              CONCAT16(in_stack_fffffffffffffd3e,
                                       CONCAT15(in_stack_fffffffffffffd3d,
                                                CONCAT14(in_stack_fffffffffffffd3c,
                                                         in_stack_fffffffffffffd38)))),
             (char *)in_stack_fffffffffffffd30,(uint *)in_stack_fffffffffffffd28,
             (unsigned_long *)in_stack_fffffffffffffd20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))));
    testing::AssertionResult::failure_message((AssertionResult *)0x11790c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))),
               in_stack_fffffffffffffd4c,(char *)in_stack_fffffffffffffd40,
               CONCAT13(in_stack_fffffffffffffd3f,
                        CONCAT12(in_stack_fffffffffffffd3e,
                                 CONCAT11(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd3c))),
               (char *)in_stack_fffffffffffffd30);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
    testing::Message::~Message((Message *)0x117969);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1179da);
  fmt::File::~File((File *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_b8);
  fmt::File::~File((File *)in_stack_fffffffffffffd30);
  mp::MemoryMappedFile<fmt::File>::~MemoryMappedFile((MemoryMappedFile<fmt::File> *)0x117a0e);
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    testing::internal::RE::RE(in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
    local_180 = local_210;
    in_stack_fffffffffffffd56 =
         testing::internal::DeathTest::Create
                   ((char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                    (char *)in_stack_fffffffffffffd20,
                    (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),(DeathTest **)0x117a74);
    if ((bool)in_stack_fffffffffffffd56) {
      if (local_218 != (DeathTest *)0x0) {
        testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr
                  (&local_220,local_218);
        in_stack_fffffffffffffd50 = (*local_218->_vptr_DeathTest[2])();
        if (in_stack_fffffffffffffd50 == 0) {
          in_stack_fffffffffffffd4c = (*local_218->_vptr_DeathTest[3])();
          in_stack_fffffffffffffd3f = testing::internal::ExitedUnsuccessfully(0);
          uVar3 = (*local_218->_vptr_DeathTest[4])(local_218,(ulong)(byte)in_stack_fffffffffffffd3f)
          ;
          in_stack_fffffffffffffd3e = (undefined1)uVar3;
          in_stack_fffffffffffffd40 = local_218;
          if ((uVar3 & 1) != 0) goto LAB_00117dac;
          bVar1 = true;
        }
        else {
          if (in_stack_fffffffffffffd50 == 1) {
            testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_228,local_218);
            in_stack_fffffffffffffd3d = testing::internal::AlwaysTrue();
            (*local_218->_vptr_DeathTest[5])(local_218,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                      ((ReturnSentinel *)0x117d16);
          }
LAB_00117dac:
          bVar1 = false;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                  ((scoped_ptr<testing::internal::DeathTest> *)0x117dc4);
        if (bVar1) goto LAB_00117ded;
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
LAB_00117ded:
    testing::internal::RE::~RE(in_stack_fffffffffffffd20);
    if (!bVar1) goto LAB_00117ed9;
  }
  testing::Message::Message
            ((Message *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd56,
                                     CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)))
            );
  testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd56,
                                     CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)))
             ,in_stack_fffffffffffffd4c,(char *)in_stack_fffffffffffffd40,
             CONCAT13(in_stack_fffffffffffffd3f,
                      CONCAT12(in_stack_fffffffffffffd3e,
                               CONCAT11(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd3c))),
             (char *)in_stack_fffffffffffffd30);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
  testing::Message::~Message((Message *)0x117e91);
LAB_00117ed9:
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DoubleMap) {
  std::string filename1 = GetExecutableDir() + "/test1";
  WriteFile(filename1, "abc");
  const volatile char *start = 0;
  {
    MemoryMappedFile<> f;
    File file1(filename1, File::RDONLY);
    f.map(file1, static_cast<std::size_t>(file1.size()));
    std::string filename2 = GetExecutableDir() + "/test2";
    WriteFile(filename2, "defg");
    File file2(filename2, File::RDONLY);
    f.map(file2, static_cast<std::size_t>(file2.size()));
    start = f.start();
    EXPECT_EQ("defg", std::string(f.start(), 4));
    EXPECT_EQ(4u, f.size());
  }
  EXPECT_DEATH((void)*start, "");
}